

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Chapters::ExpandEditionsArray(Chapters *this)

{
  Edition *pEVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Edition *this_00;
  ulong uVar6;
  Edition *local_a8;
  Edition *local_80;
  int local_74;
  int local_68;
  int idx;
  Edition *editions;
  int size;
  Chapters *this_local;
  
  if (this->m_editions_count < this->m_editions_size) {
    this_local._7_1_ = true;
  }
  else {
    if (this->m_editions_size == 0) {
      local_74 = 1;
    }
    else {
      local_74 = this->m_editions_size << 1;
    }
    uVar3 = (ulong)local_74;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_80 = (Edition *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_80 = (Edition *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_a8 = local_80;
        do {
          Edition::Edition(local_a8);
          local_a8 = local_a8 + 1;
        } while (local_a8 != local_80 + uVar3);
      }
    }
    if (local_80 == (Edition *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (local_68 = 0; local_68 < this->m_editions_count; local_68 = local_68 + 1) {
        Edition::ShallowCopy(this->m_editions + local_68,local_80 + local_68);
      }
      pEVar1 = this->m_editions;
      if (pEVar1 != (Edition *)0x0) {
        this_00 = pEVar1 + *(long *)&pEVar1[-1].m_atoms_size;
        while (pEVar1 != this_00) {
          this_00 = this_00 + -1;
          Edition::~Edition(this_00);
        }
        operator_delete__(&pEVar1[-1].m_atoms_size);
      }
      this->m_editions = local_80;
      this->m_editions_size = local_74;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Chapters::ExpandEditionsArray() {
  if (m_editions_size > m_editions_count)
    return true;  // nothing else to do

  const int size = (m_editions_size == 0) ? 1 : 2 * m_editions_size;

  Edition* const editions = new (std::nothrow) Edition[size];

  if (editions == NULL)
    return false;

  for (int idx = 0; idx < m_editions_count; ++idx) {
    m_editions[idx].ShallowCopy(editions[idx]);
  }

  delete[] m_editions;
  m_editions = editions;

  m_editions_size = size;
  return true;
}